

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

double units::generateLeadingNumber(string *ustring,size_t *index)

{
  units *this;
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  string *string;
  undefined1 *index_00;
  string *__pos;
  double dVar5;
  double dVar6;
  size_t oindex;
  size_t local_60;
  double local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  *index = 0;
  dVar5 = getNumberBlock(ustring,index);
  if (NAN(dVar5)) {
    *index = 0;
  }
  else {
    __pos = (string *)*index;
    string = (string *)ustring->_M_string_length;
    if (__pos < string) {
      do {
        this = (units *)(ustring->_M_dataplus)._M_p;
        uVar2 = (ulong)(byte)this[(long)__pos];
        if (uVar2 < 0x30) {
          if ((0x840000000000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_004045ac;
          if (uVar2 != 0x28) {
            if ((0x680000000000U >> (uVar2 & 0x3f) & 1) != 0) {
              *index = 0;
              return NAN;
            }
            goto LAB_004045a3;
          }
          local_60 = 0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_50,ustring,(size_type)__pos,0xffffffffffffffff);
          dVar6 = getNumberBlock(&local_50,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            local_58 = dVar6;
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            dVar6 = local_58;
          }
          if (NAN(dVar6)) {
            return dVar5;
          }
          dVar5 = dVar5 * dVar6;
          sVar3 = local_60;
          sVar4 = *index;
        }
        else {
LAB_004045a3:
          if (this[(long)__pos] != (units)0x78) {
            return dVar5;
          }
LAB_004045ac:
          index_00 = (undefined1 *)((long)&(__pos->_M_dataplus)._M_p + 1);
          bVar1 = looksLikeNumber(this,string,(size_t)index_00);
          if ((!bVar1) && (this[(long)index_00] != (units)0x28)) {
            return dVar5;
          }
          local_60 = 0;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_50,ustring,(size_type)index_00,0xffffffffffffffff);
          dVar6 = getNumberBlock(&local_50,&local_60);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            local_58 = dVar6;
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            dVar6 = local_58;
          }
          if (NAN(dVar6)) {
            return dVar5;
          }
          sVar3 = *index;
          sVar4 = local_60;
          if ((ustring->_M_dataplus)._M_p[sVar3] == '/') {
            dVar5 = dVar5 / dVar6;
          }
          else {
            dVar5 = dVar5 * dVar6;
          }
        }
        __pos = (string *)(sVar3 + sVar4 + 1);
        *index = (size_t)__pos;
        string = (string *)ustring->_M_string_length;
      } while (__pos < string);
    }
  }
  return dVar5;
}

Assistant:

double generateLeadingNumber(const std::string& ustring, size_t& index) noexcept
{
    index = 0;
    double val = getNumberBlock(ustring, index);
    if (std::isnan(val)) {
        index = 0;
        return val;
    }
    while (true) {
        if (index >= ustring.size()) {
            return val;
        }
        switch (ustring[index]) {
            case '.':
            case '-':
            case '+':
                index = 0;
                return constants::invalid_conversion;
            case '/':
            case '*':
            case 'x':
                if (looksLikeNumber(ustring, index + 1) ||
                    ustring[index + 1] == '(') {
                    size_t oindex{0};
                    double res =
                        getNumberBlock(ustring.substr(index + 1), oindex);
                    if (!std::isnan(res)) {
                        if (ustring[index] == '/') {
                            val /= res;
                        } else {
                            val *= res;
                        }

                        index = oindex + index + 1;
                    } else {
                        return val;
                    }
                } else {
                    return val;
                }
                break;
            case '(': {
                size_t oindex{0};
                double res = getNumberBlock(ustring.substr(index), oindex);
                if (!std::isnan(res)) {
                    val *= res;
                    index = oindex + index + 1;
                } else {
                    return val;
                }
                break;
            }
            default:
                return val;
        }
    }
}